

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O2

int ImGuizmo::GetMoveType(vec_t *gizmoHitProportion)

{
  int iVar1;
  ImGuiIO *pIVar2;
  ulong uVar3;
  int iVar4;
  vec_t *plan;
  vec_t *p_normal;
  uint axisIndex;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  vec_t vVar9;
  bool belowPlaneLimit;
  bool belowAxisLimit;
  vec_t dirPlaneY;
  vec_t posOnPlan;
  vec_t dirPlaneX;
  vec_t local_78;
  vec_t direction [3];
  
  pIVar2 = ImGui::GetIO();
  fVar5 = (pIVar2->MousePos).x;
  axisIndex = 0;
  iVar1 = 0;
  if ((_DAT_001f12c4 <= fVar5) && (fVar5 <= DAT_001f12cc)) {
    fVar5 = (pIVar2->MousePos).y;
    iVar1 = 7;
    if (fVar5 < DAT_001f12c8 || DAT_001f12d0 < fVar5) {
      iVar1 = 0;
    }
  }
  direction[0].x = _DAT_001f10cc;
  direction[0].y = _DAT_001f10d0;
  direction[0].z = _DAT_001f10d4;
  direction[0].w = DAT_001f10d4_4;
  direction[1].x = _DAT_001f10dc;
  direction[1].y = DAT_001f10dc_4;
  direction[1].z = (float)uRam00000000001f10e4;
  direction[1].w = uRam00000000001f10e4._4_4_;
  direction[2].x = _DAT_001f10ec;
  direction[2].y = DAT_001f10ec_4;
  direction[2].z = (float)uRam00000000001f10f4;
  direction[2].w = uRam00000000001f10f4._4_4_;
  while ((axisIndex < 3 && (iVar1 == 0))) {
    ComputeTripodAxisAndVisibility(axisIndex,&dirPlaneX,&dirPlaneY,&belowAxisLimit,&belowPlaneLimit)
    ;
    vec_t::TransformVector(&dirPlaneX,(matrix_t *)&DAT_001f10cc);
    vec_t::TransformVector(&dirPlaneY,(matrix_t *)&DAT_001f10cc);
    uVar3 = (ulong)(axisIndex - 1);
    if (axisIndex == 0) {
      uVar3 = 2;
    }
    p_normal = direction + uVar3;
    posOnPlan = BuildPlan((vec_t *)&DAT_001f10fc,p_normal);
    fVar5 = IntersectRayPlane(&posOnPlan,p_normal,plan);
    local_78 = vec_t::operator*((vec_t *)&DAT_001f12ac,fVar5);
    posOnPlan = vec_t::operator+((vec_t *)&DAT_001f129c,&local_78);
    vVar9 = vec_t::operator-(&posOnPlan,(vec_t *)&DAT_001f10fc);
    fVar6 = 1.0 / DAT_001f12d4;
    fVar8 = vVar9.x * fVar6;
    fVar5 = vVar9.y * fVar6;
    fVar6 = fVar6 * vVar9.z;
    fVar7 = fVar6 * dirPlaneX.z + fVar8 * dirPlaneX.x + fVar5 * dirPlaneX.y;
    fVar5 = fVar6 * dirPlaneY.z + fVar8 * dirPlaneY.x + fVar5 * dirPlaneY.y;
    iVar4 = axisIndex + 1;
    if (belowAxisLimit == false) {
      iVar4 = 0;
    }
    if (fVar5 <= -0.1) {
      iVar4 = 0;
    }
    if (0.1 <= fVar5) {
      iVar4 = 0;
    }
    if (fVar7 <= 0.1) {
      iVar4 = 0;
    }
    if (1.0 <= fVar7) {
      iVar4 = 0;
    }
    iVar1 = iVar4;
    if (belowPlaneLimit != false) {
      iVar1 = axisIndex + 4;
    }
    if (fVar7 < 0.5) {
      iVar1 = iVar4;
    }
    if (0.8 < fVar7) {
      iVar1 = iVar4;
    }
    if (fVar5 < 0.5) {
      iVar1 = iVar4;
    }
    if (0.8 < fVar5) {
      iVar1 = iVar4;
    }
    if (gizmoHitProportion != (vec_t *)0x0) {
      gizmoHitProportion->x = fVar7;
      gizmoHitProportion->y = fVar5;
      gizmoHitProportion->z = 0.0;
      gizmoHitProportion->w = 0.0;
    }
    axisIndex = axisIndex + 1;
  }
  return iVar1;
}

Assistant:

static int GetMoveType(vec_t *gizmoHitProportion)
   {
      ImGuiIO& io = ImGui::GetIO();
      int type = NONE;

      // screen
      if (io.MousePos.x >= gContext.mScreenSquareMin.x && io.MousePos.x <= gContext.mScreenSquareMax.x &&
         io.MousePos.y >= gContext.mScreenSquareMin.y && io.MousePos.y <= gContext.mScreenSquareMax.y)
         type = MOVE_SCREEN;

      const vec_t direction[3] = { gContext.mModel.v.right, gContext.mModel.v.up, gContext.mModel.v.dir };

      // compute
      for (unsigned int i = 0; i < 3 && type == NONE; i++)
      {
         vec_t dirPlaneX, dirPlaneY;
         bool belowAxisLimit, belowPlaneLimit;
         ComputeTripodAxisAndVisibility(i, dirPlaneX, dirPlaneY, belowAxisLimit, belowPlaneLimit);
         dirPlaneX.TransformVector(gContext.mModel);
         dirPlaneY.TransformVector(gContext.mModel);

         const int planNormal = (i + 2) % 3;

         const float len = IntersectRayPlane(gContext.mRayOrigin, gContext.mRayVector, BuildPlan(gContext.mModel.v.position, direction[planNormal]));
         vec_t posOnPlan = gContext.mRayOrigin + gContext.mRayVector * len;

         const float dx = dirPlaneX.Dot3((posOnPlan - gContext.mModel.v.position) * (1.f / gContext.mScreenFactor));
         const float dy = dirPlaneY.Dot3((posOnPlan - gContext.mModel.v.position) * (1.f / gContext.mScreenFactor));
         if (belowAxisLimit && dy > -0.1f && dy < 0.1f && dx > 0.1f  && dx < 1.f)
            type = MOVE_X + i;

         if (belowPlaneLimit && dx >= quadUV[0] && dx <= quadUV[4] && dy >= quadUV[1] && dy <= quadUV[3])
            type = MOVE_XY + i;

         if (gizmoHitProportion)
            *gizmoHitProportion = makeVect(dx, dy, 0.f);
      }
      return type;
   }